

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_Font * ON_Font::Internal_BestMatchWeightStretchStyle
                    (Weight prefered_weight,Stretch prefered_stretch,Style prefered_style,
                    ON_Font **font_list,size_t font_count)

{
  ON_Font *available_font;
  uint uVar1;
  uint delta;
  ON_Font *font;
  size_t i;
  ON_Font *pOStack_30;
  uint best_delta;
  ON_Font *best_font;
  size_t font_count_local;
  ON_Font **font_list_local;
  Style prefered_style_local;
  Stretch prefered_stretch_local;
  ON_Font *pOStack_10;
  Weight prefered_weight_local;
  
  if ((font_list == (ON_Font **)0x0) || (font_count == 0)) {
    pOStack_10 = (ON_Font *)0x0;
  }
  else {
    pOStack_30 = (ON_Font *)0x0;
    i._4_4_ = 0xffffffff;
    for (font = (ON_Font *)0x0; font < font_count;
        font = (ON_Font *)((long)&font->m_runtime_serial_number + 1)) {
      available_font = font_list[(long)font];
      if (available_font != (ON_Font *)0x0) {
        uVar1 = WeightStretchStyleDeviation
                          (prefered_weight,prefered_stretch,prefered_style,available_font);
        if (uVar1 == 0) {
          return available_font;
        }
        if ((pOStack_30 == (ON_Font *)0x0) || (uVar1 < i._4_4_)) {
          i._4_4_ = uVar1;
          pOStack_30 = available_font;
        }
      }
    }
    pOStack_10 = pOStack_30;
  }
  return pOStack_10;
}

Assistant:

const ON_Font* ON_Font::Internal_BestMatchWeightStretchStyle(
  ON_Font::Weight prefered_weight,
  ON_Font::Stretch prefered_stretch,
  ON_Font::Style prefered_style,
  ON_Font const * const * font_list, 
  size_t font_count
)
{
  if (nullptr == font_list || font_count <= 0)
    return nullptr;

  const ON_Font* best_font = nullptr;
  unsigned int best_delta = 0xFFFFFFFF;
  for (size_t i = 0; i < font_count; i++)
  {
    const ON_Font* font = font_list[i];
    if (nullptr == font)
      continue;
    const unsigned int delta = ON_Font::WeightStretchStyleDeviation(
      prefered_weight, 
      prefered_stretch, 
      prefered_style,
      font
    );
    if (0 == delta)
      return font;
    if (nullptr == best_font || delta < best_delta)
    {
      best_font = font;
      best_delta = delta;
    }
  }

  return best_font;
}